

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

bool __thiscall CoreML::RangeValue::operator<=(RangeValue *this,RangeValue *other)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  
  bVar2 = true;
  if (other->_isUnbound == false) {
    if (this->_isUnbound == false) {
      uVar1 = this->_val;
      sVar3 = value(other);
      return uVar1 <= sVar3;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RangeValue::operator<= (const RangeValue& other) const {
    if (other.isUnbound())
        return true;
    else if (_isUnbound)
        return false;
    else
        return (_val <= other.value());
}